

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_particles.cxx
# Opt level: O3

void __thiscall xray_re::xr_particle_object::load(xr_particle_object *this,xr_reader *r)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint16_t version;
  short local_12;
  
  local_12 = (short)((ulong)in_RAX >> 0x30);
  sVar1 = xr_reader::r_raw_chunk(r,1,&local_12,2);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_particles.cxx"
                  ,0x11,"virtual void xray_re::xr_particle_object::load(xr_reader &)");
  }
  if (local_12 == 0x11) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar1 = xr_reader::find_chunk(r,2);
    if (sVar1 != 0) {
      xr_reader::r_sz(r,&this->m_reference);
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_particles.cxx"
                  ,0x15,"virtual void xray_re::xr_particle_object::load(xr_reader &)");
  }
  __assert_fail("version == CPSOBJECT_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_particles.cxx"
                ,0x12,"virtual void xray_re::xr_particle_object::load(xr_reader &)");
}

Assistant:

void xr_particle_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(CPSOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == CPSOBJECT_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(CPSOBJECT_CHUNK_REFERENCE))
		xr_not_expected();
	r.r_sz(m_reference);
	r.debug_find_chunk();
}